

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O2

void __thiscall QGraphicsRotation::setOrigin(QGraphicsRotation *this,QVector3D *point)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  lVar1 = *(long *)(this + 8);
  fVar2 = (float)*(undefined8 *)(lVar1 + 0x80);
  fVar3 = (float)*(undefined8 *)point->v;
  if ((((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) &&
      ((float)((ulong)*(undefined8 *)(lVar1 + 0x80) >> 0x20) ==
       (float)((ulong)*(undefined8 *)point->v >> 0x20))) &&
     ((*(float *)(lVar1 + 0x88) == point->v[2] &&
      (!NAN(*(float *)(lVar1 + 0x88)) && !NAN(point->v[2]))))) {
    return;
  }
  *(float *)(lVar1 + 0x88) = point->v[2];
  *(undefined8 *)(lVar1 + 0x80) = *(undefined8 *)point->v;
  QGraphicsTransform::update((QGraphicsTransform *)this);
  originChanged(this);
  return;
}

Assistant:

void QGraphicsRotation::setOrigin(const QVector3D &point)
{
    Q_D(QGraphicsRotation);
    if (d->origin == point)
        return;
    d->origin = point;
    update();
    emit originChanged();
}